

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  undefined1 *puVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  char *pEnd;
  undefined1 *puVar10;
  char *pEnd_2;
  byte *pBuf;
  undefined1 *puVar11;
  uchar *q;
  byte *pbVar12;
  byte *pbVar13;
  char *pEnd_3;
  byte *pBuf_00;
  char *pEnd_1;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  int iCol2;
  int iCol1;
  byte *local_88;
  int local_48;
  int local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (byte *)*pp;
  pBuf = (byte *)*pp1;
  pBuf_00 = (byte *)*pp2;
  local_44 = 0;
  local_48 = 0;
  if (*pBuf == 1) {
    if ((char)pBuf[1] < '\0') {
      uVar5 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_44);
      uVar7 = (ulong)uVar5;
    }
    else {
      uVar7 = 1;
      local_44 = (int)(char)pBuf[1];
    }
    if (local_44 != 0) {
      pBuf = pBuf + 1 + uVar7;
      goto LAB_001cdcd5;
    }
  }
  else {
LAB_001cdcd5:
    if (*pBuf_00 == 1) {
      if ((char)pBuf_00[1] < '\0') {
        uVar5 = sqlite3Fts3GetVarint32((char *)(pBuf_00 + 1),&local_48);
        uVar7 = (ulong)uVar5;
      }
      else {
        uVar7 = 1;
        local_48 = (int)(char)pBuf_00[1];
      }
      if (local_48 == 0) goto LAB_001ce0d3;
      pBuf_00 = pBuf_00 + 1 + uVar7;
    }
    do {
      iVar6 = local_44;
      while (pbVar12 = local_88, iVar6 != local_48) {
        if (iVar6 < local_48) {
          bVar3 = *pBuf;
          if (1 < bVar3) {
            do {
              bVar4 = bVar3 & 0x80;
              bVar3 = pBuf[1];
              pBuf = pBuf + 1;
            } while ((bVar3 & 0xfe) != 0 || bVar4 != 0);
          }
          if (*pBuf == 0) goto LAB_001ce073;
          if ((char)pBuf[1] < '\0') {
            uVar5 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_44);
            uVar7 = (ulong)uVar5;
          }
          else {
            uVar7 = 1;
            local_44 = (int)(char)pBuf[1];
          }
          pBuf = pBuf + 1 + uVar7;
          iVar6 = local_44;
        }
        else {
          bVar3 = *pBuf_00;
          if (1 < bVar3) {
            do {
              bVar4 = bVar3 & 0x80;
              bVar3 = pBuf_00[1];
              pBuf_00 = pBuf_00 + 1;
            } while ((bVar3 & 0xfe) != 0 || bVar4 != 0);
          }
          if (*pBuf_00 == 0) goto LAB_001ce073;
          if ((char)pBuf_00[1] < '\0') {
            uVar5 = sqlite3Fts3GetVarint32((char *)(pBuf_00 + 1),&local_48);
            uVar7 = (ulong)uVar5;
          }
          else {
            uVar7 = 1;
            local_48 = (int)(char)pBuf_00[1];
          }
          pBuf_00 = pBuf_00 + 1 + uVar7;
        }
      }
      if (iVar6 != 0) {
        *local_88 = 1;
        uVar7 = (long)local_44;
        pbVar12 = local_88 + 1;
        do {
          pbVar13 = pbVar12;
          bVar3 = (byte)uVar7;
          *pbVar13 = bVar3 | 0x80;
          pbVar12 = pbVar13 + 1;
          bVar2 = 0x7f < uVar7;
          uVar7 = uVar7 >> 7;
        } while (bVar2);
        *pbVar13 = bVar3;
      }
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = sqlite3Fts3GetVarintU((char *)pBuf,(sqlite_uint64 *)&local_40);
      puVar11 = local_40;
      pBuf = pBuf + iVar6;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar6 = sqlite3Fts3GetVarintU((char *)pBuf_00,(sqlite_uint64 *)&local_40);
      pBuf_00 = pBuf_00 + iVar6;
      if ((long)local_40 < 2 || (long)puVar11 < 2) {
        bVar2 = false;
      }
      else {
        puVar10 = local_40 + -2;
        puVar8 = (undefined1 *)0x0;
        while( true ) {
          puVar11 = puVar11 + -2;
          puVar1 = puVar11 + nToken;
          while( true ) {
            if ((puVar10 == puVar1) ||
               ((((long)puVar10 <= (long)puVar1 && (isExact == 0)) &&
                ((long)puVar11 < (long)puVar10)))) {
              puVar14 = puVar11;
              if (isSaveLeft == 0) {
                puVar14 = puVar10;
              }
              puVar8 = puVar14 + (2 - (long)puVar8);
              do {
                pbVar13 = pbVar12;
                bVar3 = (byte)puVar8;
                *pbVar13 = bVar3 | 0x80;
                pbVar12 = pbVar13 + 1;
                bVar2 = (undefined1 *)0x7f < puVar8;
                puVar8 = (undefined1 *)((ulong)puVar8 >> 7);
              } while (bVar2);
              *pbVar13 = bVar3;
              local_88 = (byte *)0x0;
              puVar8 = puVar14;
            }
            if (((long)puVar11 < (long)puVar10) && (isSaveLeft != 0 || (long)puVar1 < (long)puVar10)
               ) break;
            if (*pBuf_00 < 2) goto LAB_001cdfa0;
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            iVar6 = sqlite3Fts3GetVarintU((char *)pBuf_00,(sqlite_uint64 *)&local_40);
            pBuf_00 = pBuf_00 + iVar6;
            puVar10 = puVar10 + (long)local_40 + -2;
          }
          if (*pBuf < 2) break;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          iVar6 = sqlite3Fts3GetVarintU((char *)pBuf,(sqlite_uint64 *)&local_40);
          pBuf = pBuf + iVar6;
          puVar11 = puVar11 + (long)local_40;
        }
LAB_001cdfa0:
        if (local_88 != (byte *)0x0) {
          pbVar12 = local_88;
        }
        bVar3 = *pBuf;
        if (1 < bVar3) {
          do {
            bVar4 = bVar3 & 0x80;
            bVar3 = pBuf[1];
            pBuf = pBuf + 1;
          } while ((bVar3 & 0xfe) != 0 || bVar4 != 0);
        }
        bVar3 = *pBuf_00;
        if (1 < bVar3) {
          do {
            bVar4 = bVar3 & 0x80;
            bVar3 = pBuf_00[1];
            pBuf_00 = pBuf_00 + 1;
          } while ((bVar3 & 0xfe) != 0 || bVar4 != 0);
        }
        if ((*pBuf == 0) || (*pBuf_00 == 0)) {
          bVar2 = false;
        }
        else {
          if ((char)pBuf[1] < '\0') {
            uVar5 = sqlite3Fts3GetVarint32((char *)(pBuf + 1),&local_44);
            uVar7 = (ulong)uVar5;
          }
          else {
            uVar7 = 1;
            local_44 = (int)(char)pBuf[1];
          }
          if ((char)pBuf_00[1] < '\0') {
            uVar5 = sqlite3Fts3GetVarint32((char *)(pBuf_00 + 1),&local_48);
            uVar9 = (ulong)uVar5;
          }
          else {
            uVar9 = 1;
            local_48 = (int)(char)pBuf_00[1];
          }
          pBuf = pBuf + 1 + uVar7;
          pBuf_00 = pBuf_00 + 1 + uVar9;
          bVar2 = true;
        }
      }
      local_88 = pbVar12;
    } while (bVar2);
LAB_001ce073:
    bVar3 = *pBuf_00;
    if (*pBuf_00 != 0) {
      do {
        pbVar13 = pBuf_00 + 1;
        pBuf_00 = pBuf_00 + 1;
        bVar4 = bVar3 & 0x80;
        bVar3 = *pbVar13;
      } while (bVar4 != 0 || *pbVar13 != 0);
    }
    bVar3 = *pBuf;
    if (*pBuf != 0) {
      do {
        pbVar13 = pBuf + 1;
        pBuf = pBuf + 1;
        bVar4 = bVar3 & 0x80;
        bVar3 = *pbVar13;
      } while (bVar4 != 0 || *pbVar13 != 0);
    }
    *pp1 = (char *)(pBuf + 1);
    *pp2 = (char *)(pBuf_00 + 1);
    if ((byte *)*pp != pbVar12) {
      *pbVar12 = 0;
      *pp = (char *)(pbVar12 + 1);
      iVar6 = 1;
      goto LAB_001ce0d5;
    }
  }
LAB_001ce0d3:
  iVar6 = 0;
LAB_001ce0d5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert_fts3_nc( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
    /* iCol1==0 indicates corruption. Column 0 does not have a POS_COLUMN
    ** entry, so this is actually end-of-doclist. */
    if( iCol1==0 ) return 0;
  }
  if( *p2==POS_COLUMN ){
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
    /* As above, iCol2==0 indicates corruption. */
    if( iCol2==0 ) return 0;
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken)
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next
    ** column-number in the position list.
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}